

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

void Js::JavascriptObject::Restify
               (Var source,Var to,void *excludedStatic,void *excludedComputed,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint32 i_1;
  uint32 i;
  ulong uVar5;
  undefined1 local_60 [8];
  BVSparse<Memory::Recycler> excluded;
  RecyclableObject *target;
  
  excluded.lastUsedNodePrevNextField.ptr = (WriteBarrierPtr<BVSparseNode<Memory::Recycler>_> *)0x0;
  BVar3 = JavascriptConversion::ToObject
                    (to,scriptContext,(RecyclableObject **)&excluded.lastUsedNodePrevNextField);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x8b4,"(succeeded)","succeeded");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BVSparse<Memory::Recycler>::BVSparse
            ((BVSparse<Memory::Recycler> *)local_60,scriptContext->recycler);
  for (uVar5 = 0; uVar5 < *excludedStatic; uVar5 = uVar5 + 1) {
    BVSparse<Memory::Recycler>::Set
              ((BVSparse<Memory::Recycler> *)local_60,
               *(BVIndex *)((long)excludedStatic + uVar5 * 4 + 8));
  }
  if (excludedStatic != excludedComputed) {
    for (uVar5 = 0; uVar5 < *excludedComputed; uVar5 = uVar5 + 1) {
      BVSparse<Memory::Recycler>::Set
                ((BVSparse<Memory::Recycler> *)local_60,
                 *(BVIndex *)((long)excludedComputed + uVar5 * 4 + 8));
    }
  }
  CopyDataPropertiesHelper<false,false>
            (source,(RecyclableObject *)excluded.lastUsedNodePrevNextField.ptr,scriptContext,
             (BVSparse<Memory::Recycler> *)local_60);
  BVSparse<Memory::Recycler>::~BVSparse((BVSparse<Memory::Recycler> *)local_60);
  return;
}

Assistant:

void JavascriptObject::Restify(Var source, Var to, void* excludedStatic, void* excludedComputed, ScriptContext* scriptContext)
{
    RecyclableObject* target = nullptr;
    bool succeeded = JavascriptConversion::ToObject(to, scriptContext, &target);
    AssertOrFailFast(succeeded);

    const Js::PropertyIdArray* propIdsStatic = reinterpret_cast<const Js::PropertyIdArray*>(excludedStatic);
    const Js::PropertyIdArray* propIdsComputed = reinterpret_cast<const Js::PropertyIdArray*>(excludedComputed);
    // Create a set of the property ids for faster lookup
    BVSparse<Recycler> excluded(scriptContext->GetRecycler());
    for (uint32 i = 0; i < propIdsStatic->count; i++)
    {
        PropertyId id = propIdsStatic->elements[i];
        excluded.Set(id);
    }
    // If these two are equal, this means there were no computed properties
    // and the static array was passed in to indicate this
    if (propIdsStatic != propIdsComputed)
    {
        for (uint32 i = 0; i < propIdsComputed->count; i++)
        {
            PropertyId id = propIdsComputed->elements[i];
            excluded.Set(id);
        }
    }

    CopyDataPropertiesHelper<false, false>(source, target, scriptContext, &excluded);
}